

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample_x86_avx::forward
          (GridSample_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  Mat *src;
  Mat *this_00;
  size_t sVar7;
  int *piVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Option *opt_00;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  Allocator *pAVar19;
  undefined1 (*pauVar20) [32];
  undefined1 (*pauVar21) [16];
  void *pvVar22;
  char *__ptr;
  int *offset_ptr;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int i_1;
  undefined4 *puVar27;
  int i;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar42;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar44 [16];
  float fVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [28];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 in_ZMM5 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar77 [64];
  __m256 y_coeffs3;
  __m256 y_coeffs2;
  __m256 y_coeffs1;
  __m256 y_coeffs0;
  __m256 x_coeffs3;
  __m256 x_coeffs2;
  __m256 x_coeffs1;
  __m256 x_coeffs0;
  __m256 value_f [4];
  size_t sStackY_2e8;
  undefined1 local_2a0 [32];
  Allocator *local_280;
  int iStack_278;
  int iStack_274;
  size_t sStack_270;
  int local_268;
  size_t local_260;
  Mat local_250;
  Allocator *local_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 auStack_e4 [4];
  float local_e0 [4];
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = src->elempack;
  iVar15 = src->c;
  iVar23 = src->dims;
  sVar7 = src->elemsize;
  local_260 = 0;
  local_2a0._0_8_ = (Allocator *)0x0;
  local_2a0._8_4_ = 0;
  local_2a0._12_4_ = 0;
  local_2a0._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_250.cstep = 0;
  sStack_270 = SUB168(ZEXT816(0) << 0x40,4);
  local_268 = 0;
  local_250.h = 0;
  local_280 = (Allocator *)local_2a0._0_8_;
  iStack_278 = local_2a0._8_4_;
  iStack_274 = local_2a0._12_4_;
  local_250.data = (void *)local_2a0._0_8_;
  local_250.refcount._0_4_ = local_2a0._8_4_;
  local_250.refcount._4_4_ = local_2a0._12_4_;
  local_250.elemsize = sStack_270;
  local_250.elempack = local_268;
  local_250.allocator = (Allocator *)local_2a0._0_8_;
  local_250.dims = local_2a0._8_4_;
  local_250.w = local_2a0._12_4_;
  local_250.d = local_2a0._8_4_;
  local_250.c = local_268;
  if (src[1].elempack == 1) {
    if (&local_250 != src + 1) {
      piVar8 = src[1].refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_250.data = src[1].data;
      local_250.refcount._0_4_ = (int)src[1].refcount;
      local_250.refcount._4_4_ = (int)((ulong)src[1].refcount >> 0x20);
      local_250.elemsize = src[1].elemsize;
      local_250.elempack = src[1].elempack;
      local_250.allocator = src[1].allocator;
      uVar2 = src[1].dims;
      uVar3 = src[1].w;
      uVar4 = src[1].h;
      uVar5 = src[1].d;
      local_250.c = src[1].c;
      local_250.cstep = src[1].cstep;
      local_250.dims = uVar2;
      local_250.w = uVar3;
      local_250.h = uVar4;
      local_250.d = uVar5;
    }
  }
  else {
    convert_packing(src + 1,&local_250,1,opt);
  }
  iVar26 = -100;
  if (iVar23 == 3) {
    iVar13 = local_250.h;
    iVar14 = local_250.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar13 = local_250.c;
      iVar14 = local_250.h;
    }
    Mat::create(this_00,iVar14,iVar13,iVar15,sVar7,uVar6,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_00530037;
    iVar15 = (this->super_GridSample).sample_type;
    if (iVar15 == 1) {
      Mat::create((Mat *)local_2a0,iVar14,iVar13,sVar7 * 6,6,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_00530037;
      iVar15 = (this->super_GridSample).padding_mode;
      if (iVar15 == 3) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
LAB_0052ec6f:
        iVar15 = (this->super_GridSample).sample_type;
        goto LAB_0052ec7a;
      }
      if (iVar15 == 2) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        goto LAB_0052ec6f;
      }
      if (iVar15 == 1) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        goto LAB_0052ec6f;
      }
LAB_0053000d:
      fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
      fputc(10,_stderr);
      goto LAB_00530037;
    }
LAB_0052ec7a:
    if (iVar15 == 2) {
      Mat::create((Mat *)local_2a0,iVar14,iVar13,1,sVar7,1,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_00530037;
      iVar15 = (this->super_GridSample).padding_mode;
      if (iVar15 == 3) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
      else if (iVar15 == 2) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
      else {
        if (iVar15 != 1) goto LAB_0053000d;
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create((Mat *)local_2a0,iVar14,iVar13,sVar7 * 0x12,0x12,opt->workspace_allocator);
      if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0))
      goto LAB_00530037;
      iVar15 = (this->super_GridSample).padding_mode;
      if (iVar15 == 3) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
      else if (iVar15 == 2) {
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
      else {
        if (iVar15 != 1) goto LAB_005300bd;
        iVar15 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_250,(Mat *)local_2a0,iVar15);
        }
      }
    }
    bVar28 = false;
  }
  else {
    if (iVar23 == 4) {
      iVar26 = local_250.d;
      iVar13 = local_250.w;
      iVar14 = local_250.h;
      if ((this->super_GridSample).permute_fusion == 0) {
        iVar26 = local_250.c;
        iVar13 = local_250.h;
        iVar14 = local_250.d;
      }
      Mat::create(this_00,iVar13,iVar14,iVar26,iVar15,sVar7,uVar6,opt->blob_allocator);
      if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
        iVar15 = (this->super_GridSample).sample_type;
        if (iVar15 != 1) {
LAB_0052ef1c:
          if (iVar15 != 2) goto LAB_0052f0cf;
          Mat::create((Mat *)local_2a0,iVar13,iVar14,iVar26,1,sVar7,1,opt->workspace_allocator);
          if ((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) goto LAB_00530007;
          iVar26 = -100;
          if ((long)local_268 * local_260 == 0) goto LAB_00530037;
          iVar15 = (this->super_GridSample).padding_mode;
          if (iVar15 == 3) {
            iVar15 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
LAB_0052f0cf:
            bVar28 = true;
            if ((this->super_GridSample).sample_type != 3) goto LAB_0052f0eb;
            __ptr = "unsupported bicubic when dims == 4";
            sStackY_2e8 = 0x22;
            goto LAB_0052fff3;
          }
          if (iVar15 == 2) {
            iVar15 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
            goto LAB_0052f0cf;
          }
          if (iVar15 == 1) {
            iVar15 = (this->super_GridSample).permute_fusion;
            if ((this->super_GridSample).align_corner == 0) {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
            else {
              gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                        (src,&local_250,(Mat *)local_2a0,iVar15);
            }
            goto LAB_0052f0cf;
          }
LAB_005300bd:
          iVar26 = -100;
          fwrite("gridsample padding_mode error\n",0x1e,1,_stderr);
          fputc(10,_stderr);
          goto LAB_00530037;
        }
        Mat::create((Mat *)local_2a0,iVar13,iVar14,iVar26,sVar7 * 0xb,0xb,opt->workspace_allocator);
        if (((Allocator *)local_2a0._0_8_ == (Allocator *)0x0) || ((long)local_268 * local_260 == 0)
           ) goto LAB_00530007;
        iVar15 = (this->super_GridSample).padding_mode;
        if (iVar15 == 3) {
          iVar15 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
LAB_0052ef11:
          iVar15 = (this->super_GridSample).sample_type;
          goto LAB_0052ef1c;
        }
        if (iVar15 == 2) {
          iVar15 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
          goto LAB_0052ef11;
        }
        if (iVar15 == 1) {
          iVar15 = (this->super_GridSample).permute_fusion;
          if ((this->super_GridSample).align_corner == 0) {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
          else {
            gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                      (src,&local_250,(Mat *)local_2a0,iVar15);
          }
          goto LAB_0052ef11;
        }
        __ptr = "gridsample padding_mode error\n";
        sStackY_2e8 = 0x1e;
LAB_0052fff3:
        fwrite(__ptr,sStackY_2e8,1,_stderr);
        fputc(10,_stderr);
      }
LAB_00530007:
      iVar26 = -100;
      goto LAB_00530037;
    }
    bVar28 = false;
  }
LAB_0052f0eb:
  opt_00 = (Option *)(ulong)uVar6;
  iVar15 = 0;
  iVar26 = iVar15;
  if (uVar6 == 1) {
    if (iVar23 == 3) {
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 == 3) {
        iVar15 = this_00->h * this_00->w;
        pvVar9 = src->data;
        sVar7 = src->elemsize;
        sVar10 = src->cstep;
        pvVar22 = this_00->data;
        sVar11 = this_00->elemsize;
        sVar12 = this_00->cstep;
        local_208 = (Allocator *)local_2a0._0_8_;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        uVar18 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar18 = 0;
        }
        for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
          lVar25 = sVar7 * sVar10 * uVar17;
          puVar27 = (undefined4 *)(sVar11 * sVar12 * uVar17 + (long)pvVar22);
          pAVar19 = local_208;
          for (iVar23 = 0; iVar23 != iVar15; iVar23 = iVar23 + 1) {
            cubic_interp1d(&local_120,&local_140,&local_160,&local_180,
                           *(float *)&pAVar19->_vptr_Allocator);
            cubic_interp1d(&local_1a0,&local_1c0,&local_1e0,&local_200,
                           *(float *)((long)&pAVar19->_vptr_Allocator + 4));
            for (lVar24 = 2; lVar24 != 0x12; lVar24 = lVar24 + 4) {
              lVar16 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + lVar24 * 4);
              fVar43 = 0.0;
              fVar48 = 0.0;
              if (-1 < lVar16) {
                fVar48 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar25);
              }
              lVar16 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + lVar24 * 4 + 4);
              if (-1 < lVar16) {
                fVar43 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar25);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24 * 4);
              fVar54 = 0.0;
              fVar57 = 0.0;
              if (-1 < lVar16) {
                fVar57 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar25);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24 * 4 + 4);
              if (-1 < lVar16) {
                fVar54 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar25);
              }
              *(float *)((long)local_e0 + lVar24 + -2) =
                   fVar43 * local_140 + fVar48 * local_120 + fVar57 * local_160 + fVar54 * local_180
              ;
            }
            auVar34 = vinsertps_avx(ZEXT416((uint)local_1a0),ZEXT416((uint)local_1c0),0x10);
            auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)local_1e0),0x20);
            auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)local_200),0x30);
            auVar35._0_4_ = auVar34._0_4_ * local_e0[0];
            auVar35._4_4_ = auVar34._4_4_ * local_e0[1];
            auVar35._8_4_ = auVar34._8_4_ * local_e0[2];
            auVar35._12_4_ = auVar34._12_4_ * local_e0[3];
            auVar34 = vhaddps_avx(auVar35,auVar35);
            auVar34 = vhaddps_avx(auVar34,auVar34);
            *puVar27 = auVar34._0_4_;
            puVar27 = puVar27 + 1;
            pAVar19 = pAVar19 + 9;
          }
        }
LAB_0052fdc9:
        iVar26 = 0;
        goto LAB_00530037;
      }
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          iVar15 = this_00->h * this_00->w;
          pvVar9 = src->data;
          sVar7 = src->elemsize;
          sVar10 = src->cstep;
          pvVar22 = this_00->data;
          sVar11 = this_00->elemsize;
          sVar12 = this_00->cstep;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          uVar18 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar24 = sVar7 * sVar10 * uVar17;
            pAVar19 = (Allocator *)local_2a0._0_8_;
            for (lVar25 = 0; iVar15 != (int)lVar25; lVar25 = lVar25 + 1) {
              fVar43 = 0.0;
              fVar48 = 0.0;
              if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                fVar48 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar43 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar54 = 0.0;
              fVar57 = 0.0;
              if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                fVar57 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar54 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar74 = *(float *)&pAVar19[2]._vptr_Allocator;
              fVar48 = (1.0 - fVar74) * fVar48 + fVar74 * fVar43;
              *(float *)((long)pvVar22 + lVar25 * 4) =
                   (((1.0 - fVar74) * fVar57 + fVar74 * fVar54) - fVar48) *
                   *(float *)((long)&pAVar19[2]._vptr_Allocator + 4) + fVar48;
              pAVar19 = pAVar19 + 3;
            }
            pvVar22 = (void *)((long)pvVar22 + sVar11 * sVar12);
          }
        }
        goto LAB_00530037;
      }
    }
    else {
      if (!bVar28) goto LAB_00530037;
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          iVar15 = this_00->h * this_00->w * this_00->d;
          pvVar9 = src->data;
          sVar7 = src->elemsize;
          sVar10 = src->cstep;
          pvVar22 = this_00->data;
          sVar11 = this_00->elemsize;
          sVar12 = this_00->cstep;
          iVar26 = 0;
          if (iVar15 < 1) {
            iVar15 = iVar26;
          }
          uVar18 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar24 = sVar7 * sVar10 * uVar17;
            pAVar19 = (Allocator *)local_2a0._0_8_;
            for (lVar25 = 0; iVar15 != (int)lVar25; lVar25 = lVar25 + 1) {
              fVar43 = 0.0;
              fVar48 = 0.0;
              if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                fVar48 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar43 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar54 = 0.0;
              fVar57 = 0.0;
              if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                fVar57 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar54 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar61 = 0.0;
              fVar74 = 0.0;
              if (-1 < (long)*(int *)&pAVar19[2]._vptr_Allocator) {
                fVar74 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19[2]._vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar61 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar75 = 0.0;
              fVar42 = 0.0;
              if (-1 < (long)*(int *)&pAVar19[3]._vptr_Allocator) {
                fVar42 = *(float *)((long)pvVar9 +
                                   (long)*(int *)&pAVar19[3]._vptr_Allocator * 4 + lVar24);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[3]._vptr_Allocator + 4);
              if (-1 < lVar16) {
                fVar75 = *(float *)((long)pvVar9 + lVar16 * 4 + lVar24);
              }
              fVar62 = *(float *)&pAVar19[4]._vptr_Allocator;
              fVar67 = *(float *)((long)&pAVar19[4]._vptr_Allocator + 4);
              fVar68 = 1.0 - fVar62;
              fVar48 = (fVar68 * fVar48 + fVar62 * fVar43) * (1.0 - fVar67) +
                       fVar67 * (fVar68 * fVar57 + fVar62 * fVar54);
              *(float *)((long)pvVar22 + lVar25 * 4) =
                   (((fVar68 * fVar74 + fVar62 * fVar61) * (1.0 - fVar67) +
                    fVar67 * (fVar68 * fVar42 + fVar62 * fVar75)) - fVar48) *
                   *(float *)&pAVar19[5]._vptr_Allocator + fVar48;
              pAVar19 = (Allocator *)((long)&pAVar19[5]._vptr_Allocator + 4);
            }
            pvVar22 = (void *)((long)pvVar22 + sVar11 * sVar12);
          }
        }
        goto LAB_00530037;
      }
    }
    gridsample_nearest_apply_interpolation_p1(src,this_00,(Mat *)local_2a0,opt_00);
  }
  else {
    if (uVar6 != 4) {
      iVar26 = 0;
      if (uVar6 != 8) goto LAB_00530037;
      if (iVar23 == 3) {
        iVar23 = (this->super_GridSample).sample_type;
        if (iVar23 == 3) {
          iVar15 = this_00->h * this_00->w;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          uVar18 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar25 = src->cstep * uVar17 * src->elemsize;
            pvVar9 = src->data;
            pauVar20 = (undefined1 (*) [32])
                       (this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
            pAVar19 = (Allocator *)local_2a0._0_8_;
            for (iVar23 = 0; iVar23 != iVar15; iVar23 = iVar23 + 1) {
              local_e0[0] = *(float *)&pAVar19->_vptr_Allocator;
              local_e0[1] = local_e0[0];
              local_e0[2] = local_e0[0];
              local_e0[3] = local_e0[0];
              fStack_d0 = local_e0[0];
              fStack_cc = local_e0[0];
              fStack_c8 = local_e0[0];
              fStack_c4 = local_e0[0];
              cubic_interp1d_p8((__m256 *)&local_120,(__m256 *)&local_140,(__m256 *)&local_160,
                                (__m256 *)&local_180,(__m256 *)local_e0);
              local_e0[0] = *(float *)((long)&pAVar19->_vptr_Allocator + 4);
              local_e0[1] = local_e0[0];
              local_e0[2] = local_e0[0];
              local_e0[3] = local_e0[0];
              fStack_d0 = local_e0[0];
              fStack_cc = local_e0[0];
              fStack_c8 = local_e0[0];
              fStack_c4 = local_e0[0];
              cubic_interp1d_p8((__m256 *)&local_1a0,(__m256 *)&local_1c0,(__m256 *)&local_1e0,
                                (__m256 *)&local_200,(__m256 *)local_e0);
              for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 0x10) {
                lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24);
                fVar57 = 0.0;
                fVar54 = 0.0;
                fVar48 = 0.0;
                fVar43 = 0.0;
                fVar74 = 0.0;
                fVar61 = 0.0;
                fVar42 = 0.0;
                fVar75 = 0.0;
                fVar68 = 0.0;
                fVar69 = 0.0;
                fVar62 = 0.0;
                fVar67 = 0.0;
                fVar70 = 0.0;
                fVar71 = 0.0;
                fVar72 = 0.0;
                fVar73 = 0.0;
                if (-1 < lVar16) {
                  pfVar1 = (float *)((long)pvVar9 + lVar16 * 4 + lVar25);
                  fVar62 = *pfVar1;
                  fVar67 = pfVar1[1];
                  fVar68 = pfVar1[2];
                  fVar69 = pfVar1[3];
                  fVar70 = pfVar1[4];
                  fVar71 = pfVar1[5];
                  fVar72 = pfVar1[6];
                  fVar73 = pfVar1[7];
                }
                lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24 + 4);
                if (-1 < lVar16) {
                  pfVar1 = (float *)((long)pvVar9 + lVar16 * 4 + lVar25);
                  fVar48 = *pfVar1;
                  fVar43 = pfVar1[1];
                  fVar57 = pfVar1[2];
                  fVar54 = pfVar1[3];
                  fVar74 = pfVar1[4];
                  fVar61 = pfVar1[5];
                  fVar42 = pfVar1[6];
                  fVar75 = pfVar1[7];
                }
                lVar16 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + lVar24);
                auVar41 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar59 = ZEXT1628(ZEXT816(0) << 0x40);
                if (-1 < lVar16) {
                  auVar59 = SUB3228(*(undefined1 (*) [32])((long)pvVar9 + lVar16 * 4 + lVar25),0);
                }
                lVar16 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + lVar24 + 4);
                if (-1 < lVar16) {
                  auVar41 = *(undefined1 (*) [32])((long)pvVar9 + lVar16 * 4 + lVar25);
                }
                auVar60._0_4_ =
                     fVar48 * local_140 + fVar62 * local_120 +
                     auVar59._0_4_ * local_160 + auVar41._0_4_ * local_180;
                auVar60._4_4_ =
                     fVar43 * fStack_13c + fVar67 * fStack_11c +
                     auVar59._4_4_ * fStack_15c + auVar41._4_4_ * fStack_17c;
                auVar60._8_4_ =
                     fVar57 * fStack_138 + fVar68 * fStack_118 +
                     auVar59._8_4_ * fStack_158 + auVar41._8_4_ * fStack_178;
                auVar60._12_4_ =
                     fVar54 * fStack_134 + fVar69 * fStack_114 +
                     auVar59._12_4_ * fStack_154 + auVar41._12_4_ * fStack_174;
                auVar60._16_4_ =
                     fVar74 * fStack_130 + fVar70 * fStack_110 +
                     auVar59._16_4_ * fStack_150 + auVar41._16_4_ * fStack_170;
                auVar60._20_4_ =
                     fVar61 * fStack_12c + fVar71 * fStack_10c +
                     auVar59._20_4_ * fStack_14c + auVar41._20_4_ * fStack_16c;
                auVar60._24_4_ =
                     fVar42 * fStack_128 + fVar72 * fStack_108 +
                     auVar59._24_4_ * fStack_148 + auVar41._24_4_ * fStack_168;
                auVar60._28_4_ = fVar75 + fVar73 + fVar73 + auVar41._28_4_;
                *(undefined1 (*) [32])((long)local_e0 + lVar24 * 2) = auVar60;
              }
              auVar41._0_4_ =
                   local_c0 * local_1c0 + local_e0[0] * local_1a0 +
                   local_a0 * local_1e0 + local_80 * local_200;
              auVar41._4_4_ =
                   fStack_bc * fStack_1bc + local_e0[1] * fStack_19c +
                   fStack_9c * fStack_1dc + fStack_7c * fStack_1fc;
              auVar41._8_4_ =
                   fStack_b8 * fStack_1b8 + local_e0[2] * fStack_198 +
                   fStack_98 * fStack_1d8 + fStack_78 * fStack_1f8;
              auVar41._12_4_ =
                   fStack_b4 * fStack_1b4 + local_e0[3] * fStack_194 +
                   fStack_94 * fStack_1d4 + fStack_74 * fStack_1f4;
              auVar41._16_4_ =
                   fStack_b0 * fStack_1b0 + fStack_d0 * fStack_190 +
                   fStack_90 * fStack_1d0 + fStack_70 * fStack_1f0;
              auVar41._20_4_ =
                   fStack_ac * fStack_1ac + fStack_cc * fStack_18c +
                   fStack_8c * fStack_1cc + fStack_6c * fStack_1ec;
              auVar41._24_4_ =
                   fStack_a8 * fStack_1a8 + fStack_c8 * fStack_188 +
                   fStack_88 * fStack_1c8 + fStack_68 * fStack_1e8;
              auVar41._28_4_ = fStack_a4 + fStack_c4 + fStack_a4 + fStack_84;
              *pauVar20 = auVar41;
              pauVar20 = pauVar20 + 1;
              pAVar19 = pAVar19 + 9;
            }
          }
          goto LAB_00530037;
        }
        if (iVar23 != 2) {
          iVar26 = iVar15;
          if (iVar23 == 1) {
            iVar15 = this_00->h * this_00->w;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            uVar18 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar18 = 0;
            }
            for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
              lVar25 = src->cstep * uVar17 * src->elemsize;
              pvVar9 = src->data;
              pauVar20 = (undefined1 (*) [32])
                         (this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
              pAVar19 = (Allocator *)local_2a0._0_8_;
              iVar23 = iVar15;
              while (bVar28 = iVar23 != 0, iVar23 = iVar23 + -1, bVar28) {
                fVar57 = 0.0;
                fVar54 = 0.0;
                fVar48 = 0.0;
                fVar43 = 0.0;
                fVar74 = 0.0;
                fVar61 = 0.0;
                fVar42 = 0.0;
                fVar75 = 0.0;
                auVar41 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                  auVar41 = *(undefined1 (*) [32])
                             ((long)pvVar9 + (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar25);
                }
                lVar24 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
                if (-1 < lVar24) {
                  pfVar1 = (float *)((long)pvVar9 + lVar24 * 4 + lVar25);
                  fVar48 = *pfVar1;
                  fVar43 = pfVar1[1];
                  fVar57 = pfVar1[2];
                  fVar54 = pfVar1[3];
                  fVar74 = pfVar1[4];
                  fVar61 = pfVar1[5];
                  fVar42 = pfVar1[6];
                  fVar75 = pfVar1[7];
                }
                auVar39 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar40 = ZEXT1632(ZEXT816(0) << 0x40);
                if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                  auVar40 = *(undefined1 (*) [32])
                             ((long)pvVar9 + (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar25)
                  ;
                }
                lVar24 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
                if (-1 < lVar24) {
                  auVar39 = *(undefined1 (*) [32])((long)pvVar9 + lVar24 * 4 + lVar25);
                }
                fVar62 = *(float *)&pAVar19[2]._vptr_Allocator;
                auVar52._0_4_ = fVar62 * auVar41._0_4_;
                auVar52._4_4_ = fVar62 * auVar41._4_4_;
                auVar52._8_4_ = fVar62 * auVar41._8_4_;
                auVar52._12_4_ = fVar62 * auVar41._12_4_;
                auVar52._16_4_ = fVar62 * auVar41._16_4_;
                auVar52._20_4_ = fVar62 * auVar41._20_4_;
                auVar52._28_36_ = in_ZMM5._28_36_;
                auVar52._24_4_ = fVar62 * auVar41._24_4_;
                in_ZMM5 = ZEXT3264(auVar52._0_32_);
                auVar41 = vsubps_avx(auVar41,auVar52._0_32_);
                auVar36._0_4_ = auVar41._0_4_ + fVar62 * fVar48;
                auVar36._4_4_ = auVar41._4_4_ + fVar62 * fVar43;
                auVar36._8_4_ = auVar41._8_4_ + fVar62 * fVar57;
                auVar36._12_4_ = auVar41._12_4_ + fVar62 * fVar54;
                auVar36._16_4_ = auVar41._16_4_ + fVar62 * fVar74;
                auVar36._20_4_ = auVar41._20_4_ + fVar62 * fVar61;
                auVar36._24_4_ = auVar41._24_4_ + fVar62 * fVar42;
                auVar36._28_4_ = auVar41._28_4_ + fVar75;
                auVar41 = vsubps_avx(auVar39,auVar40);
                auVar46._0_4_ = fVar62 * auVar41._0_4_ + auVar40._0_4_;
                auVar46._4_4_ = fVar62 * auVar41._4_4_ + auVar40._4_4_;
                auVar46._8_4_ = fVar62 * auVar41._8_4_ + auVar40._8_4_;
                auVar46._12_4_ = fVar62 * auVar41._12_4_ + auVar40._12_4_;
                auVar46._16_4_ = fVar62 * auVar41._16_4_ + auVar40._16_4_;
                auVar46._20_4_ = fVar62 * auVar41._20_4_ + auVar40._20_4_;
                auVar46._24_4_ = fVar62 * auVar41._24_4_ + auVar40._24_4_;
                auVar46._28_4_ = auVar41._28_4_ + auVar40._28_4_;
                fVar48 = *(float *)((long)&pAVar19[2]._vptr_Allocator + 4);
                auVar41 = vsubps_avx(auVar46,auVar36);
                auVar37._0_4_ = auVar41._0_4_ * fVar48 + auVar36._0_4_;
                auVar37._4_4_ = auVar41._4_4_ * fVar48 + auVar36._4_4_;
                auVar37._8_4_ = auVar41._8_4_ * fVar48 + auVar36._8_4_;
                auVar37._12_4_ = auVar41._12_4_ * fVar48 + auVar36._12_4_;
                auVar37._16_4_ = auVar41._16_4_ * fVar48 + auVar36._16_4_;
                auVar37._20_4_ = auVar41._20_4_ * fVar48 + auVar36._20_4_;
                auVar37._24_4_ = auVar41._24_4_ * fVar48 + auVar36._24_4_;
                auVar37._28_4_ = auVar41._28_4_ + auVar36._28_4_;
                *pauVar20 = auVar37;
                pauVar20 = pauVar20 + 1;
                pAVar19 = pAVar19 + 3;
              }
            }
          }
          goto LAB_00530037;
        }
      }
      else {
        iVar26 = iVar15;
        if (!bVar28) goto LAB_00530037;
        iVar23 = (this->super_GridSample).sample_type;
        if (iVar23 != 2) {
          if (iVar23 == 1) {
            iVar15 = this_00->h * this_00->w * this_00->d;
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            uVar18 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar18 = 0;
            }
            for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
              lVar25 = src->cstep * uVar17 * src->elemsize;
              pvVar9 = src->data;
              pauVar20 = (undefined1 (*) [32])
                         (this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
              pAVar19 = (Allocator *)local_2a0._0_8_;
              iVar23 = iVar15;
              while (bVar28 = iVar23 != 0, iVar23 = iVar23 + -1, bVar28) {
                fVar57 = 0.0;
                fVar54 = 0.0;
                fVar48 = 0.0;
                fVar43 = 0.0;
                fVar74 = 0.0;
                fVar61 = 0.0;
                fVar42 = 0.0;
                fVar75 = 0.0;
                auVar41 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                  auVar41 = *(undefined1 (*) [32])
                             ((long)pvVar9 + (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar25);
                }
                lVar24 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
                if (-1 < lVar24) {
                  pfVar1 = (float *)((long)pvVar9 + lVar24 * 4 + lVar25);
                  fVar48 = *pfVar1;
                  fVar43 = pfVar1[1];
                  fVar57 = pfVar1[2];
                  fVar54 = pfVar1[3];
                  fVar74 = pfVar1[4];
                  fVar61 = pfVar1[5];
                  fVar42 = pfVar1[6];
                  fVar75 = pfVar1[7];
                }
                auVar40 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
                if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                  auVar52 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)pvVar9 +
                                      (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar25));
                }
                lVar24 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
                if (-1 < lVar24) {
                  auVar40 = *(undefined1 (*) [32])((long)pvVar9 + lVar24 * 4 + lVar25);
                }
                auVar59 = ZEXT1628(ZEXT816(0) << 0x40);
                auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
                if (-1 < (long)*(int *)&pAVar19[2]._vptr_Allocator) {
                  auVar65 = ZEXT3264(*(undefined1 (*) [32])
                                      ((long)pvVar9 +
                                      (long)*(int *)&pAVar19[2]._vptr_Allocator * 4 + lVar25));
                }
                lVar24 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + 4);
                if (-1 < lVar24) {
                  auVar59 = SUB3228(*(undefined1 (*) [32])((long)pvVar9 + lVar24 * 4 + lVar25),0);
                }
                auVar47 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar39 = ZEXT1632(ZEXT816(0) << 0x40);
                if (-1 < (long)*(int *)&pAVar19[3]._vptr_Allocator) {
                  auVar39 = *(undefined1 (*) [32])
                             ((long)pvVar9 + (long)*(int *)&pAVar19[3]._vptr_Allocator * 4 + lVar25)
                  ;
                }
                lVar24 = (long)*(int *)((long)&pAVar19[3]._vptr_Allocator + 4);
                if (-1 < lVar24) {
                  auVar47 = *(undefined1 (*) [32])((long)pvVar9 + lVar24 * 4 + lVar25);
                }
                fVar62 = *(float *)&pAVar19[4]._vptr_Allocator;
                auVar77._0_4_ = fVar62 * auVar41._0_4_;
                auVar77._4_4_ = fVar62 * auVar41._4_4_;
                auVar77._8_4_ = fVar62 * auVar41._8_4_;
                auVar77._12_4_ = fVar62 * auVar41._12_4_;
                auVar77._16_4_ = fVar62 * auVar41._16_4_;
                auVar77._20_4_ = fVar62 * auVar41._20_4_;
                auVar77._28_36_ = in_ZMM9._28_36_;
                auVar77._24_4_ = fVar62 * auVar41._24_4_;
                in_ZMM9 = ZEXT3264(auVar77._0_32_);
                auVar41 = vsubps_avx(auVar41,auVar77._0_32_);
                auVar38._0_4_ = auVar41._0_4_ + fVar62 * fVar48;
                auVar38._4_4_ = auVar41._4_4_ + fVar62 * fVar43;
                auVar38._8_4_ = auVar41._8_4_ + fVar62 * fVar57;
                auVar38._12_4_ = auVar41._12_4_ + fVar62 * fVar54;
                auVar38._16_4_ = auVar41._16_4_ + fVar62 * fVar74;
                auVar38._20_4_ = auVar41._20_4_ + fVar62 * fVar61;
                auVar38._24_4_ = auVar41._24_4_ + fVar62 * fVar42;
                auVar38._28_4_ = auVar41._28_4_ + fVar75;
                auVar41 = vsubps_avx(auVar40,auVar52._0_32_);
                auVar53._0_4_ = fVar62 * auVar65._0_4_;
                auVar53._4_4_ = fVar62 * auVar65._4_4_;
                auVar53._8_4_ = fVar62 * auVar65._8_4_;
                auVar53._12_4_ = fVar62 * auVar65._12_4_;
                auVar53._16_4_ = fVar62 * auVar65._16_4_;
                auVar53._20_4_ = fVar62 * auVar65._20_4_;
                auVar53._28_36_ = auVar52._28_36_;
                auVar53._24_4_ = fVar62 * auVar65._24_4_;
                auVar56 = vsubps_avx(auVar65._0_32_,auVar53._0_32_);
                auVar51._0_4_ = auVar56._0_4_ + fVar62 * auVar59._0_4_;
                auVar51._4_4_ = auVar56._4_4_ + fVar62 * auVar59._4_4_;
                auVar51._8_4_ = auVar56._8_4_ + fVar62 * auVar59._8_4_;
                auVar51._12_4_ = auVar56._12_4_ + fVar62 * auVar59._12_4_;
                auVar51._16_4_ = auVar56._16_4_ + fVar62 * auVar59._16_4_;
                auVar51._20_4_ = auVar56._20_4_ + fVar62 * auVar59._20_4_;
                auVar51._24_4_ = auVar56._24_4_ + fVar62 * auVar59._24_4_;
                auVar51._28_4_ = auVar56._28_4_ + auVar40._28_4_;
                auVar40 = vsubps_avx(auVar47,auVar39);
                fVar48 = *(float *)((long)&pAVar19[4]._vptr_Allocator + 4);
                auVar56._0_4_ = fVar62 * auVar40._0_4_ + auVar39._0_4_;
                auVar56._4_4_ = fVar62 * auVar40._4_4_ + auVar39._4_4_;
                auVar56._8_4_ = fVar62 * auVar40._8_4_ + auVar39._8_4_;
                auVar56._12_4_ = fVar62 * auVar40._12_4_ + auVar39._12_4_;
                auVar56._16_4_ = fVar62 * auVar40._16_4_ + auVar39._16_4_;
                auVar56._20_4_ = fVar62 * auVar40._20_4_ + auVar39._20_4_;
                auVar56._24_4_ = fVar62 * auVar40._24_4_ + auVar39._24_4_;
                auVar56._28_4_ = auVar40._28_4_ + auVar39._28_4_;
                auVar66._0_4_ = auVar38._0_4_ * fVar48;
                auVar66._4_4_ = auVar38._4_4_ * fVar48;
                auVar66._8_4_ = auVar38._8_4_ * fVar48;
                auVar66._12_4_ = auVar38._12_4_ * fVar48;
                auVar66._16_4_ = auVar38._16_4_ * fVar48;
                auVar66._20_4_ = auVar38._20_4_ * fVar48;
                auVar66._28_36_ = auVar65._28_36_;
                auVar66._24_4_ = auVar38._24_4_ * fVar48;
                auVar40 = vsubps_avx(auVar38,auVar66._0_32_);
                auVar39._0_4_ = auVar40._0_4_ + (fVar62 * auVar41._0_4_ + auVar52._0_4_) * fVar48;
                auVar39._4_4_ = auVar40._4_4_ + (fVar62 * auVar41._4_4_ + auVar52._4_4_) * fVar48;
                auVar39._8_4_ = auVar40._8_4_ + (fVar62 * auVar41._8_4_ + auVar52._8_4_) * fVar48;
                auVar39._12_4_ =
                     auVar40._12_4_ + (fVar62 * auVar41._12_4_ + auVar52._12_4_) * fVar48;
                auVar39._16_4_ =
                     auVar40._16_4_ + (fVar62 * auVar41._16_4_ + auVar52._16_4_) * fVar48;
                auVar39._20_4_ =
                     auVar40._20_4_ + (fVar62 * auVar41._20_4_ + auVar52._20_4_) * fVar48;
                auVar39._24_4_ =
                     auVar40._24_4_ + (fVar62 * auVar41._24_4_ + auVar52._24_4_) * fVar48;
                auVar39._28_4_ = auVar40._28_4_ + auVar41._28_4_ + auVar52._28_4_;
                auVar41 = vsubps_avx(auVar56,auVar51);
                auVar47._0_4_ = auVar41._0_4_ * fVar48 + auVar51._0_4_;
                auVar47._4_4_ = auVar41._4_4_ * fVar48 + auVar51._4_4_;
                auVar47._8_4_ = auVar41._8_4_ * fVar48 + auVar51._8_4_;
                auVar47._12_4_ = auVar41._12_4_ * fVar48 + auVar51._12_4_;
                auVar47._16_4_ = auVar41._16_4_ * fVar48 + auVar51._16_4_;
                auVar47._20_4_ = auVar41._20_4_ * fVar48 + auVar51._20_4_;
                auVar47._24_4_ = auVar41._24_4_ * fVar48 + auVar51._24_4_;
                auVar47._28_4_ = auVar41._28_4_ + auVar51._28_4_;
                fVar48 = *(float *)&pAVar19[5]._vptr_Allocator;
                auVar41 = vsubps_avx(auVar47,auVar39);
                auVar40._0_4_ = auVar41._0_4_ * fVar48 + auVar39._0_4_;
                auVar40._4_4_ = auVar41._4_4_ * fVar48 + auVar39._4_4_;
                auVar40._8_4_ = auVar41._8_4_ * fVar48 + auVar39._8_4_;
                auVar40._12_4_ = auVar41._12_4_ * fVar48 + auVar39._12_4_;
                auVar40._16_4_ = auVar41._16_4_ * fVar48 + auVar39._16_4_;
                auVar40._20_4_ = auVar41._20_4_ * fVar48 + auVar39._20_4_;
                auVar40._24_4_ = auVar41._24_4_ * fVar48 + auVar39._24_4_;
                auVar40._28_4_ = auVar41._28_4_ + auVar39._28_4_;
                *pauVar20 = auVar40;
                pauVar20 = pauVar20 + 1;
                pAVar19 = (Allocator *)((long)&pAVar19[5]._vptr_Allocator + 4);
              }
            }
          }
          goto LAB_00530037;
        }
      }
      gridsample_nearest_apply_interpolation_p8(src,this_00,(Mat *)local_2a0,opt_00);
      iVar26 = iVar15;
      goto LAB_00530037;
    }
    if (iVar23 == 3) {
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 == 3) {
        iVar15 = this_00->h * this_00->w;
        uVar18 = 0;
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        uVar6 = this_00->c;
        if (this_00->c < 1) {
          uVar6 = 0;
        }
        for (; uVar18 != uVar6; uVar18 = uVar18 + 1) {
          lVar25 = src->cstep * uVar18 * src->elemsize;
          pvVar9 = src->data;
          pauVar21 = (undefined1 (*) [16])
                     (this_00->cstep * uVar18 * this_00->elemsize + (long)this_00->data);
          pAVar19 = (Allocator *)local_2a0._0_8_;
          for (iVar23 = 0; iVar23 != iVar15; iVar23 = iVar23 + 1) {
            local_f0 = *(float *)&pAVar19->_vptr_Allocator;
            fStack_ec = local_f0;
            fStack_e8 = local_f0;
            auStack_e4 = (undefined1  [4])local_f0;
            cubic_interp1d_p4((__m128 *)&local_120,(__m128 *)&local_140,(__m128 *)&local_160,
                              (__m128 *)&local_180,(__m128 *)&local_f0);
            local_f0 = *(float *)((long)&pAVar19->_vptr_Allocator + 4);
            fStack_ec = local_f0;
            fStack_e8 = local_f0;
            auStack_e4 = (undefined1  [4])local_f0;
            cubic_interp1d_p4((__m128 *)&local_1a0,(__m128 *)&local_1c0,(__m128 *)&local_1e0,
                              (__m128 *)&local_200,(__m128 *)&local_f0);
            for (lVar24 = 0; lVar24 != 0x40; lVar24 = lVar24 + 0x10) {
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24);
              fVar48 = 0.0;
              fVar43 = 0.0;
              fVar57 = 0.0;
              fVar54 = 0.0;
              fVar74 = 0.0;
              fVar61 = 0.0;
              fVar42 = 0.0;
              fVar75 = 0.0;
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar9 + lVar16 * 4 + lVar25);
                fVar74 = *pfVar1;
                fVar61 = pfVar1[1];
                fVar42 = pfVar1[2];
                fVar75 = pfVar1[3];
              }
              lVar16 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + lVar24 + 4);
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar9 + lVar16 * 4 + lVar25);
                fVar48 = *pfVar1;
                fVar43 = pfVar1[1];
                fVar57 = pfVar1[2];
                fVar54 = pfVar1[3];
              }
              lVar16 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + lVar24);
              fVar62 = 0.0;
              fVar67 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              auVar34 = ZEXT816(0) << 0x40;
              if (-1 < lVar16) {
                auVar34 = *(undefined1 (*) [16])((long)pvVar9 + lVar16 * 4 + lVar25);
              }
              lVar16 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + lVar24 + 4);
              if (-1 < lVar16) {
                pfVar1 = (float *)((long)pvVar9 + lVar16 * 4 + lVar25);
                fVar62 = *pfVar1;
                fVar67 = pfVar1[1];
                fVar68 = pfVar1[2];
                fVar69 = pfVar1[3];
              }
              auVar58._0_4_ =
                   fVar48 * local_140 + fVar74 * local_120 +
                   auVar34._0_4_ * local_160 + fVar62 * local_180;
              auVar58._4_4_ =
                   fVar43 * fStack_13c + fVar61 * fStack_11c +
                   auVar34._4_4_ * fStack_15c + fVar67 * fStack_17c;
              auVar58._8_4_ =
                   fVar57 * fStack_138 + fVar42 * fStack_118 +
                   auVar34._8_4_ * fStack_158 + fVar68 * fStack_178;
              auVar58._12_4_ =
                   fVar54 * fStack_134 + fVar75 * fStack_114 +
                   auVar34._12_4_ * fStack_154 + fVar69 * fStack_174;
              *(undefined1 (*) [16])((long)local_e0 + lVar24) = auVar58;
            }
            auVar34._0_4_ =
                 fStack_d0 * local_1c0 + local_e0[0] * local_1a0 +
                 local_c0 * local_1e0 + fStack_b0 * local_200;
            auVar34._4_4_ =
                 fStack_cc * fStack_1bc + local_e0[1] * fStack_19c +
                 fStack_bc * fStack_1dc + fStack_ac * fStack_1fc;
            auVar34._8_4_ =
                 fStack_c8 * fStack_1b8 + local_e0[2] * fStack_198 +
                 fStack_b8 * fStack_1d8 + fStack_a8 * fStack_1f8;
            auVar34._12_4_ =
                 fStack_c4 * fStack_1b4 + local_e0[3] * fStack_194 +
                 fStack_b4 * fStack_1d4 + fStack_a4 * fStack_1f4;
            *pauVar21 = auVar34;
            pauVar21 = pauVar21 + 1;
            pAVar19 = pAVar19 + 9;
          }
        }
        goto LAB_0052fdc9;
      }
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          iVar15 = this_00->h * this_00->w;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          uVar18 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar25 = src->cstep * uVar17 * src->elemsize;
            pvVar9 = src->data;
            pauVar21 = (undefined1 (*) [16])
                       (this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
            pAVar19 = (Allocator *)local_2a0._0_8_;
            iVar23 = iVar15;
            while (bVar28 = iVar23 != 0, iVar23 = iVar23 + -1, bVar28) {
              fVar48 = 0.0;
              fVar43 = 0.0;
              fVar57 = 0.0;
              fVar54 = 0.0;
              auVar34 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                auVar34 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
              if (-1 < lVar24) {
                pfVar1 = (float *)((long)pvVar9 + lVar24 * 4 + lVar25);
                fVar48 = *pfVar1;
                fVar43 = pfVar1[1];
                fVar57 = pfVar1[2];
                fVar54 = pfVar1[3];
              }
              auVar33 = ZEXT816(0) << 0x40;
              auVar35 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                auVar35 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
              if (-1 < lVar24) {
                auVar33 = *(undefined1 (*) [16])((long)pvVar9 + lVar24 * 4 + lVar25);
              }
              fVar74 = *(float *)&pAVar19[2]._vptr_Allocator;
              auVar63._0_4_ = fVar74 * auVar34._0_4_;
              auVar63._4_4_ = fVar74 * auVar34._4_4_;
              auVar63._8_4_ = fVar74 * auVar34._8_4_;
              auVar63._12_4_ = fVar74 * auVar34._12_4_;
              auVar34 = vsubps_avx(auVar34,auVar63);
              auVar29._0_4_ = auVar34._0_4_ + fVar74 * fVar48;
              auVar29._4_4_ = auVar34._4_4_ + fVar74 * fVar43;
              auVar29._8_4_ = auVar34._8_4_ + fVar74 * fVar57;
              auVar29._12_4_ = auVar34._12_4_ + fVar74 * fVar54;
              auVar34 = vsubps_avx(auVar33,auVar35);
              auVar44._0_4_ = fVar74 * auVar34._0_4_ + auVar35._0_4_;
              auVar44._4_4_ = fVar74 * auVar34._4_4_ + auVar35._4_4_;
              auVar44._8_4_ = fVar74 * auVar34._8_4_ + auVar35._8_4_;
              auVar44._12_4_ = fVar74 * auVar34._12_4_ + auVar35._12_4_;
              fVar48 = *(float *)((long)&pAVar19[2]._vptr_Allocator + 4);
              auVar34 = vsubps_avx(auVar44,auVar29);
              auVar30._0_4_ = auVar34._0_4_ * fVar48 + auVar29._0_4_;
              auVar30._4_4_ = auVar34._4_4_ * fVar48 + auVar29._4_4_;
              auVar30._8_4_ = auVar34._8_4_ * fVar48 + auVar29._8_4_;
              auVar30._12_4_ = auVar34._12_4_ * fVar48 + auVar29._12_4_;
              *pauVar21 = auVar30;
              pauVar21 = pauVar21 + 1;
              pAVar19 = pAVar19 + 3;
            }
          }
        }
        goto LAB_00530037;
      }
    }
    else {
      if (!bVar28) goto LAB_00530037;
      iVar15 = (this->super_GridSample).sample_type;
      if (iVar15 != 2) {
        if (iVar15 == 1) {
          iVar15 = this_00->h * this_00->w * this_00->d;
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          uVar18 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar18 = 0;
          }
          for (uVar17 = 0; iVar26 = 0, uVar17 != uVar18; uVar17 = uVar17 + 1) {
            lVar25 = src->cstep * uVar17 * src->elemsize;
            pvVar9 = src->data;
            pauVar21 = (undefined1 (*) [16])
                       (this_00->cstep * uVar17 * this_00->elemsize + (long)this_00->data);
            pAVar19 = (Allocator *)local_2a0._0_8_;
            iVar23 = iVar15;
            while (bVar28 = iVar23 != 0, iVar23 = iVar23 + -1, bVar28) {
              fVar48 = 0.0;
              fVar43 = 0.0;
              fVar57 = 0.0;
              fVar54 = 0.0;
              auVar34 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19->_vptr_Allocator) {
                auVar34 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19->_vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19->_vptr_Allocator + 4);
              if (-1 < lVar24) {
                pfVar1 = (float *)((long)pvVar9 + lVar24 * 4 + lVar25);
                fVar48 = *pfVar1;
                fVar43 = pfVar1[1];
                fVar57 = pfVar1[2];
                fVar54 = pfVar1[3];
              }
              auVar33 = ZEXT816(0) << 0x40;
              auVar35 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19[1]._vptr_Allocator) {
                auVar35 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19[1]._vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19[1]._vptr_Allocator + 4);
              if (-1 < lVar24) {
                auVar33 = *(undefined1 (*) [16])((long)pvVar9 + lVar24 * 4 + lVar25);
              }
              fVar74 = 0.0;
              fVar61 = 0.0;
              fVar42 = 0.0;
              fVar75 = 0.0;
              auVar32 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19[2]._vptr_Allocator) {
                auVar32 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19[2]._vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19[2]._vptr_Allocator + 4);
              if (-1 < lVar24) {
                pfVar1 = (float *)((long)pvVar9 + lVar24 * 4 + lVar25);
                fVar74 = *pfVar1;
                fVar61 = pfVar1[1];
                fVar42 = pfVar1[2];
                fVar75 = pfVar1[3];
              }
              auVar55 = ZEXT816(0) << 0x40;
              auVar45 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar19[3]._vptr_Allocator) {
                auVar45 = *(undefined1 (*) [16])
                           ((long)pvVar9 + (long)*(int *)&pAVar19[3]._vptr_Allocator * 4 + lVar25);
              }
              lVar24 = (long)*(int *)((long)&pAVar19[3]._vptr_Allocator + 4);
              if (-1 < lVar24) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar9 + lVar24 * 4 + lVar25);
              }
              fVar62 = *(float *)&pAVar19[4]._vptr_Allocator;
              auVar76._0_4_ = fVar62 * auVar34._0_4_;
              auVar76._4_4_ = fVar62 * auVar34._4_4_;
              auVar76._8_4_ = fVar62 * auVar34._8_4_;
              auVar76._12_4_ = fVar62 * auVar34._12_4_;
              auVar34 = vsubps_avx(auVar34,auVar76);
              auVar31._0_4_ = auVar34._0_4_ + fVar62 * fVar48;
              auVar31._4_4_ = auVar34._4_4_ + fVar62 * fVar43;
              auVar31._8_4_ = auVar34._8_4_ + fVar62 * fVar57;
              auVar31._12_4_ = auVar34._12_4_ + fVar62 * fVar54;
              auVar34 = vsubps_avx(auVar33,auVar35);
              auVar49._0_4_ = fVar62 * auVar32._0_4_;
              auVar49._4_4_ = fVar62 * auVar32._4_4_;
              auVar49._8_4_ = fVar62 * auVar32._8_4_;
              auVar49._12_4_ = fVar62 * auVar32._12_4_;
              auVar33 = vsubps_avx(auVar32,auVar49);
              auVar50._0_4_ = auVar33._0_4_ + fVar62 * fVar74;
              auVar50._4_4_ = auVar33._4_4_ + fVar62 * fVar61;
              auVar50._8_4_ = auVar33._8_4_ + fVar62 * fVar42;
              auVar50._12_4_ = auVar33._12_4_ + fVar62 * fVar75;
              auVar33 = vsubps_avx(auVar55,auVar45);
              auVar55._0_4_ = fVar62 * auVar33._0_4_ + auVar45._0_4_;
              auVar55._4_4_ = fVar62 * auVar33._4_4_ + auVar45._4_4_;
              auVar55._8_4_ = fVar62 * auVar33._8_4_ + auVar45._8_4_;
              auVar55._12_4_ = fVar62 * auVar33._12_4_ + auVar45._12_4_;
              fVar48 = *(float *)((long)&pAVar19[4]._vptr_Allocator + 4);
              auVar64._0_4_ = auVar31._0_4_ * fVar48;
              auVar64._4_4_ = auVar31._4_4_ * fVar48;
              auVar64._8_4_ = auVar31._8_4_ * fVar48;
              auVar64._12_4_ = auVar31._12_4_ * fVar48;
              auVar33 = vsubps_avx(auVar31,auVar64);
              auVar32._0_4_ = auVar33._0_4_ + (fVar62 * auVar34._0_4_ + auVar35._0_4_) * fVar48;
              auVar32._4_4_ = auVar33._4_4_ + (fVar62 * auVar34._4_4_ + auVar35._4_4_) * fVar48;
              auVar32._8_4_ = auVar33._8_4_ + (fVar62 * auVar34._8_4_ + auVar35._8_4_) * fVar48;
              auVar32._12_4_ = auVar33._12_4_ + (fVar62 * auVar34._12_4_ + auVar35._12_4_) * fVar48;
              auVar34 = vsubps_avx(auVar55,auVar50);
              auVar45._0_4_ = auVar34._0_4_ * fVar48 + auVar50._0_4_;
              auVar45._4_4_ = auVar34._4_4_ * fVar48 + auVar50._4_4_;
              auVar45._8_4_ = auVar34._8_4_ * fVar48 + auVar50._8_4_;
              auVar45._12_4_ = auVar34._12_4_ * fVar48 + auVar50._12_4_;
              fVar48 = *(float *)&pAVar19[5]._vptr_Allocator;
              auVar34 = vsubps_avx(auVar45,auVar32);
              auVar33._0_4_ = auVar34._0_4_ * fVar48 + auVar32._0_4_;
              auVar33._4_4_ = auVar34._4_4_ * fVar48 + auVar32._4_4_;
              auVar33._8_4_ = auVar34._8_4_ * fVar48 + auVar32._8_4_;
              auVar33._12_4_ = auVar34._12_4_ * fVar48 + auVar32._12_4_;
              *pauVar21 = auVar33;
              pauVar21 = pauVar21 + 1;
              pAVar19 = (Allocator *)((long)&pAVar19[5]._vptr_Allocator + 4);
            }
          }
        }
        goto LAB_00530037;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,(Mat *)local_2a0,opt_00);
  }
LAB_00530037:
  piVar8 = (int *)CONCAT44(local_250.refcount._4_4_,(int)local_250.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_250.allocator == (Allocator *)0x0) {
        free(local_250.data);
      }
      else {
        (*(local_250.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_2a0._12_4_,local_2a0._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_280 == (Allocator *)0x0) {
        free((void *)local_2a0._0_8_);
      }
      else {
        (*local_280->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int GridSample_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}